

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Own<kj::AsyncOutputStream> __thiscall
kj::anon_unknown_30::LowLevelAsyncIoProviderImpl::wrapOutputFd
          (LowLevelAsyncIoProviderImpl *this,int fd,uint flags)

{
  uint *in_RCX;
  _func_int **pp_Var1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  Own<kj::(anonymous_namespace)::AsyncStreamFd> OVar2;
  Own<kj::AsyncOutputStream> OVar3;
  _func_int **local_20;
  long local_18;
  
  OVar2 = heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&>
                    ((kj *)&local_20,(UnixEventPort *)(CONCAT44(in_register_00000034,fd) + 8),
                     (int *)CONCAT44(in_register_00000014,flags),in_RCX);
  OVar3.ptr = OVar2.ptr;
  (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider = local_20;
  pp_Var1 = (_func_int **)(local_18 + 8);
  if (local_18 == 0) {
    pp_Var1 = (_func_int **)0x0;
  }
  (this->eventPort).super_EventPort._vptr_EventPort = pp_Var1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<AsyncOutputStream> wrapOutputFd(int fd, uint flags = 0) override {
    return heap<AsyncStreamFd>(eventPort, fd, flags);
  }